

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<char[35],unsigned_int,char[15],unsigned_int,char[14]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [35],uint *Args_1,
          char (*Args_2) [15],uint *Args_3,char (*Args_4) [14])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[35],unsigned_int,char[15],unsigned_int,char[14]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [35])this,(uint *)Args,(char (*) [15])Args_1,(uint *)Args_2,
             (char (*) [14])Args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}